

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLMaterialRenderer.h
# Opt level: O1

void __thiscall
irr::video::COpenGLMaterialRenderer_ONETEXTURE_BLEND::OnUnsetMaterial
          (COpenGLMaterialRenderer_ONETEXTURE_BLEND *this)

{
  long lVar1;
  code *pcVar2;
  
  lVar1 = *(long *)(*(long *)&(this->super_IMaterialRenderer).field_0x8 + 0xbe8);
  if (*(int *)(lVar1 + 0xac) != 0x84c0) {
    pcVar2 = *(code **)(*(long *)(lVar1 + 8) + 0x6c8);
    if ((pcVar2 != (code *)0x0) ||
       (pcVar2 = *(code **)(*(long *)(lVar1 + 8) + 0x6d0), pcVar2 != (code *)0x0)) {
      (*pcVar2)(0x84c0);
    }
    *(undefined4 *)(lVar1 + 0xac) = 0x84c0;
  }
  glTexEnvi(0x2300,0x2200,0x2100);
  glTexEnvi(0x2300,0x8572,0x2100);
  glTexEnvf(0x3f800000,0x2300,0x8573);
  glTexEnvi(0x2300,0x8581,0x8578);
  lVar1 = *(long *)(*(long *)&(this->super_IMaterialRenderer).field_0x8 + 0xbe8);
  if ((**(char **)(lVar1 + 0x78) != '\0') || (*(char *)(lVar1 + 0x82) == '\x01')) {
    (*GL.Disable)(0xbe2);
    if ((ulong)*(uint *)(lVar1 + 0x48) != 0) {
      memset(*(void **)(lVar1 + 0x78),0,(ulong)*(uint *)(lVar1 + 0x48));
    }
    *(undefined1 *)(lVar1 + 0x82) = 0;
  }
  return;
}

Assistant:

void OnUnsetMaterial() override
	{
		Driver->getCacheHandler()->setActiveTexture(GL_TEXTURE0_ARB);

		glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_MODULATE);

#ifdef GL_ARB_texture_env_combine
		glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA_ARB, GL_MODULATE);
		glTexEnvf(GL_TEXTURE_ENV, GL_RGB_SCALE_ARB, 1.f);
		glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE1_RGB_ARB, GL_PREVIOUS_ARB);
#else
		glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA_EXT, GL_MODULATE);
		glTexEnvf(GL_TEXTURE_ENV, GL_RGB_SCALE_EXT, 1.f);
		glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE1_RGB_EXT, GL_PREVIOUS_EXT);
#endif

		Driver->getCacheHandler()->setBlend(false);
	}